

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

int __thiscall gvr::PLYReader::open(PLYReader *this,char *__file,int __oflag,...)

{
  value_type pPVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  _Ios_Iostate __a;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  size_type sVar8;
  reference ppPVar9;
  reference pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *message;
  undefined8 uVar11;
  string *in_stack_00000058;
  char id [3];
  size_t i;
  PLYElement *element;
  ply_encoding encoding;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  format;
  string line;
  PLYProperty *in_stack_fffffffffffffe38;
  PLYProperty *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  ply_encoding in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  ulong local_78;
  PLYProperty *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  string local_38 [32];
  char *local_18;
  PLYReader *local_10;
  undefined1 local_1;
  
  local_18 = __file;
  local_10 = this;
  std::__cxx11::string::string(local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x123231);
  std::__cxx11::string::operator=((string *)this,local_18);
  for (local_78 = 0;
      sVar8 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size(&this->list),
      local_78 < sVar8; local_78 = local_78 + 1) {
    ppPVar9 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                        (&this->list,local_78);
    pPVar1 = *ppPVar9;
    if (pPVar1 != (value_type)0x0) {
      PLYElement::~PLYElement((PLYElement *)in_stack_fffffffffffffe40);
      operator_delete(pPVar1);
    }
  }
  std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::clear
            ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)0x123308);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) != 0) {
    std::ifstream::close();
  }
  uVar11 = *(undefined8 *)(*(long *)&this->in + -0x18);
  __a = std::operator|(_S_failbit,_S_badbit);
  std::operator|(__a,_S_eofbit);
  std::ios::exceptions((int)this + 0x20 + (int)uVar11);
  std::ifstream::open((char *)&this->in,(_Ios_Openmode)local_18);
  cVar3 = std::istream::get();
  uVar5 = std::istream::get();
  cVar4 = (char)uVar5;
  uVar6 = std::istream::get();
  if (((cVar3 == 'p') && (cVar4 == 'l')) && ((char)uVar6 == 'y')) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&this->in,local_38);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&this->in,local_38);
    gutil::trim(local_38);
    gutil::split((vector *)&local_50,local_38,' ',true);
    sVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_50);
    if (sVar8 == 3) {
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_50,0);
      iVar7 = std::__cxx11::string::compare((char *)pvVar10);
      if (iVar7 == 0) {
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_50,2);
        iVar7 = std::__cxx11::string::compare((char *)pvVar10);
        if (iVar7 == 0) {
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_50,1);
          iVar7 = std::__cxx11::string::compare((char *)pvVar10);
          if (iVar7 != 0) {
            pvVar10 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](&local_50,1);
            iVar7 = std::__cxx11::string::compare((char *)pvVar10);
            if (iVar7 != 0) {
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](&local_50,1);
              iVar7 = std::__cxx11::string::compare((char *)pvVar10);
              if (iVar7 != 0) {
                message = (string *)__cxa_allocate_exception(0x28);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_50,1);
                std::operator+((char *)CONCAT44(uVar5,uVar6),in_stack_fffffffffffffe80);
                gutil::IOException::IOException((IOException *)in_stack_fffffffffffffe80,message);
                __cxa_throw(message,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
              }
            }
          }
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&this->in,local_38);
          gutil::trim(local_38);
          while (iVar7 = std::__cxx11::string::compare((char *)local_38), iVar7 != 0) {
            iVar7 = std::__cxx11::string::compare((ulong)local_38,0,(char *)0x7);
            if (iVar7 == 0) {
              local_60 = (PLYProperty *)PLYElement::fromString(in_stack_00000058);
              std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::push_back
                        (in_stack_fffffffffffffe50,
                         (value_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                        );
            }
            else {
              iVar7 = std::__cxx11::string::compare((ulong)local_38,0,(char *)0x7);
              if (iVar7 == 0) {
                in_stack_fffffffffffffe50 = &this->list;
                PLYElement::fromString(in_stack_00000058);
                std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::push_back
                          ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                           in_stack_fffffffffffffe40,(value_type *)in_stack_fffffffffffffe38);
              }
              else {
                in_stack_fffffffffffffe4c =
                     std::__cxx11::string::compare((ulong)local_38,0,(char *)0x8);
                if (in_stack_fffffffffffffe4c == 0) {
                  if (local_60 == (PLYProperty *)0x0) {
                    uVar11 = __cxa_allocate_exception(0x28);
                    std::operator+((char *)CONCAT44(uVar5,uVar6),in_stack_fffffffffffffe80);
                    gutil::IOException::IOException
                              ((IOException *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
                    __cxa_throw(uVar11,&gutil::IOException::typeinfo,
                                gutil::IOException::~IOException);
                  }
                  in_stack_fffffffffffffe38 = local_60;
                  anon_unknown_3::PLYProperty::fromString
                            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
                  PLYElement::addProperty
                            ((PLYElement *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                  anon_unknown_3::PLYProperty::~PLYProperty(in_stack_fffffffffffffe40);
                }
              }
            }
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&this->in,local_38);
            gutil::trim(local_38);
          }
          local_1 = 1;
          goto LAB_00123a4a;
        }
      }
    }
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x28);
    std::operator+((char *)CONCAT44(uVar5,uVar6),__rhs);
    gutil::IOException::IOException((IOException *)__rhs,in_stack_fffffffffffffe78);
    __cxa_throw(__rhs,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  std::ifstream::close();
  local_1 = 0;
LAB_00123a4a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffe50);
  uVar11 = std::__cxx11::string::~string(local_38);
  return (uint)CONCAT71((int7)((ulong)uVar11 >> 8),local_1) & 0xffffff01;
}

Assistant:

bool PLYReader::open(const char *name)
{
  std::string         line;
  std::vector<std::string> format;
  ply_encoding   encoding;
  PLYElement     *element;

  filename=name;

  // empty list, close file (if necessary) and open new file

  for (size_t i=0; i<list.size(); i++)
  {
    delete list[i];
  }

  list.clear();

  if (in.is_open())
  {
    in.close();
  }

  in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
  in.open(name, std::ios_base::binary);

  // check magic code

  char id[3];
  id[0]=static_cast<char>(in.get());
  id[1]=static_cast<char>(in.get());
  id[2]=static_cast<char>(in.get());

  if (id[0] != 'p' || id[1] != 'l' || id[2] != 'y')
  {
    in.close();
    return false;
  }

  // skip rest of the line

  getline(in, line);

  // read format

  getline(in, line);
  gutil::trim(line);

  gutil::split(format, line);

  if (format.size() != 3 || format[0].compare("format") != 0 ||
      format[2].compare("1.0") != 0)
  {
    throw gutil::IOException("Unknown ply format or version: "+line);
  }

  if (format[1].compare("ascii") == 0)
  {
    encoding=ply_ascii;
  }
  else if (format[1].compare("binary_big_endian") == 0)
  {
    encoding=ply_big_endian;
  }
  else if (format[1].compare("binary_little_endian") == 0)
  {
    encoding=ply_little_endian;
  }
  else
  {
    throw gutil::IOException("Unknown ply encoding: "+format[1]);
  }

  // read all elements and properties of header

  getline(in, line);
  gutil::trim(line);

  while (line.compare("end_header") != 0)
  {
    if (line.compare(0, 7, "element") == 0)
    {
      element=PLYElement::fromString(line);
      list.push_back(element);
    }
    else if (line.compare(0, 7, "comment") == 0)
    {
      list.push_back(PLYElement::fromString(line));
    }
    else if (line.compare(0, 8, "property") == 0)
    {
      if (element == 0)
      {
        throw gutil::IOException("Property without an parent element: "+line);
      }

      element->addProperty(PLYProperty::fromString(line, encoding));
    }

    getline(in, line);
    gutil::trim(line);
  }

  return true;
}